

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  size_t sVar3;
  allocator local_69;
  string local_68;
  Handle local_44;
  undefined1 local_40 [8];
  Module libc;
  Handle proc;
  
  libc.symbols.super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  libc.symbols.super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = remote::OpenProcess(0x150c);
  bVar1 = remote::Handle::IsRunning
                    ((Handle *)
                     &libc.symbols.
                      super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    local_44.pid = libc.symbols.
                   super__Vector_base<remote::ModuleSymbol,_std::allocator<remote::ModuleSymbol>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_68,"libpthread-2.19.so",&local_69);
    remote::GetModuleHandle((Module *)local_40,local_44,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    bVar1 = remote::Module::IsValid((Module *)local_40);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"libc = ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::hex);
      sVar3 = remote::Module::GetStart((Module *)local_40);
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    remote::Module::~Module((Module *)local_40);
  }
  return 0;
}

Assistant:

int main() {

    remote::Handle proc = remote::OpenProcess(5388);

    if(proc.IsRunning()) {
        remote::Module libc = remote::GetModuleHandle(proc, "libpthread-2.19.so");

        if(libc.IsValid()) {
            // We need to grab symbol list
            cout << "libc = " << hex << libc.GetStart() << endl;
        }

        /*
        std::vector<remote::Region> rs = remote::GetRegions(proc.pid);

        for(size_t i = 0; i < rs.size(); i++) {
            if(!rs[i].filename.empty()) {
                std::cout << "Filename: " << rs[i].filename << std::endl;
            }

            if(!rs[i].pathname.empty()) {
                std::cout << "Path: " << rs[i].pathname << std::endl;
            }

            std::cout << "Start: " << std::hex << rs[i].start << std::endl;
            std::cout << "End: " << std::hex << rs[i].end << std::endl;
            std::cout << "Permissions: " << rs[i].read << rs[i].write << rs[i].exec << rs[i].shared << std::endl;
            std::cout << "Offset: " << std::hex << rs[i].offset << std::endl;
            std::cout << "Device: " << std::dec << rs[i].deviceMajor << ":" << rs[i].deviceMinor << std::endl;
            std::cout << "INode: " << std::dec << rs[i].inodeFileNumber << std::endl;
            std::cout << "-------------------------------------" << std::endl;
        }

        size_t calc_base = proc.GetModuleAddress("gnome-calculator");

        cout << "Calculator Base: " << hex << calc_base << endl;
        */
    }

    return 0;
}